

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

optional<unsigned_long> soul::AST::Connection::getEndpointIndex(Expression *e)

{
  _Storage<unsigned_long,_true> _Var1;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  pool_ptr<soul::AST::Constant> c;
  long local_68;
  PackedData local_60;
  CompileMessage local_48;
  
  uVar2 = 0;
  _Var1._M_value = __dynamic_cast(e,&Expression::typeinfo,&ArrayElementRef::typeinfo,0);
  if (_Var1._M_value != 0) {
    if (*(char *)(_Var1._M_value + 0x48) == '\x01') {
      throwInternalCompilerError("! sub->isSlice","getEndpointIndex",0x4d0);
    }
    if (*(long **)(_Var1._M_value + 0x38) == (long *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    (**(code **)(**(long **)(_Var1._M_value + 0x38) + 0x68))(&local_68);
    if (local_68 == 0) {
      CompileMessageHelpers::createMessage<>
                (&local_48,syntax,error,"Endpoint index must be a constant");
      Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_48,false);
    }
    soul::Value::getData(&local_60,(Value *)(local_68 + 0x30));
    _Var1._M_value = soul::Value::PackedData::getAsInt64(&local_60);
    uVar2 = 1;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static std::optional<size_t> getEndpointIndex (Expression& e)
        {
            if (auto sub = cast<ArrayElementRef> (e))
            {
                SOUL_ASSERT (! sub->isSlice);

                if (auto c = sub->startIndex->getAsConstant())
                    return c->value.getAsInt64();

                e.context.throwError (Errors::endpointIndexMustBeConstant());
            }

            return {};
        }